

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O2

Id __thiscall spv::Builder::getDerefTypeId(Builder *this,Id resultId)

{
  pointer ppIVar1;
  Instruction *pIVar2;
  
  ppIVar1 = (this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pIVar2 = ppIVar1[ppIVar1[resultId]->typeId];
  if (pIVar2->opCode == OpTypePointer) {
    return *(Id *)(*(long *)&(pIVar2->operands).
                             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data + 4);
  }
  __assert_fail("isPointerType(typeId)",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                ,0x245,"Id spv::Builder::getDerefTypeId(Id) const");
}

Assistant:

spv::Id getTypeId(Id resultId) const { return idToInstruction[resultId]->getTypeId(); }